

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O3

void anon_unknown.dwarf_22b6e::verifyPixelsAreEqual<Imath_3_2::half>
               (DeepImageChannel *c1,DeepImageChannel *c2,int dx,int dy)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ArgExc *this;
  ulong uVar12;
  int iVar13;
  int iVar14;
  
  lVar8 = __dynamic_cast(c1,&Imf_3_4::DeepImageChannel::typeinfo,
                         &Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::typeinfo,0);
  if (lVar8 != 0) {
    lVar9 = __dynamic_cast(c2,&Imf_3_4::DeepImageChannel::typeinfo,
                           &Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::typeinfo,0);
    if (lVar9 != 0) {
      lVar4 = *(long *)(c1 + 8);
      lVar10 = Imf_3_4::DeepImageChannel::deepLevel();
      lVar11 = Imf_3_4::DeepImageChannel::deepLevel();
      iVar7 = *(int *)(lVar4 + 0x24);
      if (*(int *)(lVar4 + 0x1c) <= iVar7) {
        iVar14 = *(int *)(lVar4 + 0x20);
        iVar13 = *(int *)(lVar4 + 0x1c);
        do {
          if (*(int *)(lVar4 + 0x18) <= iVar14) {
            iVar7 = *(int *)(lVar4 + 0x18);
            do {
              Imf_3_4::ImageChannel::boundsCheck((int)lVar10 + 0x58,iVar7);
              uVar3 = *(uint *)(*(long *)(lVar10 + 0x90) +
                               (long)(*(int *)(lVar10 + 0x74) * iVar13 + iVar7) * 4);
              iVar14 = iVar7 + dx;
              Imf_3_4::ImageChannel::boundsCheck((int)lVar11 + 0x58,iVar14);
              if (uVar3 != *(uint *)(*(long *)(lVar11 + 0x90) +
                                    (long)(*(int *)(lVar11 + 0x74) * (iVar13 + dy) + iVar14) * 4)) {
                this = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(this,"different pixel sample counts");
LAB_0010cef0:
                __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
              }
              Imf_3_4::ImageChannel::boundsCheck((int)lVar8,iVar7);
              lVar5 = *(long *)(*(long *)(lVar8 + 0x38) +
                               (long)(*(int *)(lVar8 + 0x1c) * iVar13 + iVar7) * 8);
              Imf_3_4::ImageChannel::boundsCheck((int)lVar9,iVar14);
              if (0 < (int)uVar3) {
                uVar12 = 0;
                do {
                  fVar2 = *(float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)(lVar5 + uVar12 * 2) * 4);
                  pfVar1 = (float *)(_imath_half_to_float_table +
                                    (ulong)*(ushort *)
                                            (*(long *)(*(long *)(lVar9 + 0x38) +
                                                      (long)(*(int *)(lVar9 + 0x1c) * (iVar13 + dy)
                                                            + iVar14) * 8) + uVar12 * 2) * 4);
                  if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
                    this = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this,"different sample values");
                    goto LAB_0010cef0;
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar3 != uVar12);
              }
              iVar14 = *(int *)(lVar4 + 0x20);
              bVar6 = iVar7 < iVar14;
              iVar7 = iVar7 + 1;
            } while (bVar6);
            iVar7 = *(int *)(lVar4 + 0x24);
          }
          bVar6 = iVar13 < iVar7;
          iVar13 = iVar13 + 1;
        } while (bVar6);
      }
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void
verifyPixelsAreEqual (
    const DeepImageChannel& c1, const DeepImageChannel& c2, int dx, int dy)
{
    const TypedDeepImageChannel<T>& tc1 =
        dynamic_cast<const TypedDeepImageChannel<T>&> (c1);

    const TypedDeepImageChannel<T>& tc2 =
        dynamic_cast<const TypedDeepImageChannel<T>&> (c2);

    const Box2i&              dataWindow = c1.level ().dataWindow ();
    const SampleCountChannel& scc1       = c1.deepLevel ().sampleCounts ();
    const SampleCountChannel& scc2       = c2.deepLevel ().sampleCounts ();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; ++y)
    {
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; ++x)
        {
            int n1 = scc1.at (x, y);
            int n2 = scc2.at (x + dx, y + dy);

            if (n1 != n2) throw ArgExc ("different pixel sample counts");

            const T* s1 = tc1.at (x, y);
            const T* s2 = tc2.at (x + dx, y + dy);

            for (int i = 0; i < n1; ++i)
                if (s1[i] != s2[i]) throw ArgExc ("different sample values");
        }
    }
}